

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::SubDataQueryTest::iterate(SubDataQueryTest *this)

{
  ostringstream *this_00;
  PFNGLNAMEDBUFFERDATA p_Var1;
  PFNGLGETNAMEDBUFFERSUBDATA p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar9;
  undefined4 *puVar10;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  uint uVar11;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 auVar12 [16];
  GLuint buffer;
  GLuint data [12];
  GLuint local_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar8;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    local_1dc = 0;
    p_Var1 = *(PFNGLNAMEDBUFFERDATA *)(lVar8 + 0xec0);
    this->m_pNamedBufferData = p_Var1;
    p_Var2 = *(PFNGLGETNAMEDBUFFERSUBDATA *)(lVar8 + 0x908);
    this->m_pGetNamedBufferSubData = p_Var2;
    if ((p_Var1 == (PFNGLNAMEDBUFFERDATA)0x0) || (p_Var2 == (PFNGLGETNAMEDBUFFERSUBDATA)0x0)) {
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 0;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
    (**(code **)(lVar8 + 0x3b8))(1,&local_1dc);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x866);
    (*this->m_pNamedBufferData)(local_1dc,0x30,s_reference,0x88ea);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glNamedBufferData failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x86a);
    local_1b8 = (undefined1  [16])0x0;
    local_1c8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
    (*this->m_pGetNamedBufferSubData)(local_1dc,0,0x18,local_1d8);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetNamedBufferSubData failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x86f);
    (*this->m_pGetNamedBufferSubData)(local_1dc,0x18,0x18,local_1c8 + 8);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetNamedBufferSubData failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x872);
    uVar11 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    lVar9 = 0;
    do {
      uVar11 = uVar11 | -(uint)(*(int *)(s_reference + lVar9) == *(int *)(local_1d8 + lVar9)) ^
                        0xffffffff;
      uVar13 = uVar13 | -(uint)(*(int *)(s_reference + lVar9 + 4) == *(int *)(local_1d8 + lVar9 + 4)
                               ) ^ 0xffffffff;
      uVar14 = uVar14 | -(uint)(*(int *)(s_reference + lVar9 + 8) == *(int *)(local_1d8 + lVar9 + 8)
                               ) ^ 0xffffffff;
      uVar15 = uVar15 | -(uint)(*(int *)(s_reference + lVar9 + 0xc) ==
                               *(int *)(local_1d8 + lVar9 + 0xc)) ^ 0xffffffff;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x30);
    auVar12._0_4_ = uVar11 << 0x1f;
    auVar12._4_4_ = uVar13 << 0x1f;
    auVar12._8_4_ = uVar14 << 0x1f;
    auVar12._12_4_ = uVar15 << 0x1f;
    iVar5 = movmskps(0x30,auVar12);
    if (iVar5 != 0) {
      local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "glGetNamedBufferSubData returned data which is not identical to reference data.",
                 0x4f);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_130);
    }
    if (local_1dc != 0) {
      (**(code **)(lVar8 + 0x438))(1);
      local_1dc = 0;
    }
    do {
      iVar7 = (**(code **)(lVar8 + 0x800))();
    } while (iVar7 != 0);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (iVar5 != 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SubDataQueryTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferData		 = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pGetNamedBufferSubData = (PFNGLGETNAMEDBUFFERSUBDATA)gl.getNamedBufferSubData;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pGetNamedBufferSubData))
		{
			throw 0;
		}

		/* Buffer creation. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		/* Buffer's storage allocation and reference data upload. */
		m_pNamedBufferData(buffer, s_reference_size, s_reference, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

		/* Mapping with new named buffer map function. */
		glw::GLuint data[s_reference_count] = {};
		m_pGetNamedBufferSubData(buffer, 0, s_reference_size / 2, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetNamedBufferSubData failed.");

		m_pGetNamedBufferSubData(buffer, s_reference_size / 2, s_reference_size / 2, &data[s_reference_count / 2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetNamedBufferSubData failed.");

		/* Comparison results with reference data. */
		for (glw::GLsizei i = 0; i < s_reference_count; ++i)
		{
			is_ok &= (data[i] == s_reference[i]);
		}

		if (!is_ok)
		{
			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetNamedBufferSubData returned data which is not identical to reference data."
				<< tcu::TestLog::EndMessage;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = false;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}